

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio.c
# Opt level: O1

void mode_list(cpio *cpio)

{
  bool bVar1;
  FILE *__stream;
  archive_entry *entry_00;
  int iVar2;
  wchar_t wVar3;
  mode_t mVar4;
  uint uVar5;
  archive *a;
  ulong uVar6;
  la_int64_t lVar7;
  dev_t dVar8;
  dev_t dVar9;
  char *pcVar10;
  tm *__tp;
  long lVar11;
  char *pcVar12;
  byte *pbVar13;
  byte *pbVar14;
  ulong uVar15;
  archive_entry *entry;
  char *local_120;
  cpio *local_118;
  archive *local_110;
  char *local_108;
  name_cache **local_100;
  name_cache **local_f8;
  time_t mtime;
  char date [32];
  char size [32];
  char uids [22];
  char gids [22];
  tm local_68;
  
  a = archive_read_new();
  if (a == (archive *)0x0) {
    lafe_errc(1,0,"Couldn\'t allocate archive object");
  }
  archive_read_support_filter_all(a);
  archive_read_support_format_all(a);
  if (cpio->option_pwb != 0) {
    archive_read_set_options(a,"pwb");
  }
  if (cpio->passphrase == (char *)0x0) {
    iVar2 = archive_read_set_passphrase_callback(a,cpio,passphrase_callback);
  }
  else {
    iVar2 = archive_read_add_passphrase(a,cpio->passphrase);
  }
  if (iVar2 == 0) {
    wVar3 = archive_read_open_filename(a,cpio->filename,(long)cpio->bytes_per_block);
    if (wVar3 == L'\0') {
      local_f8 = &cpio->uname_cache;
      local_100 = &cpio->gname_cache;
      local_118 = cpio;
      local_110 = a;
      while (iVar2 = archive_read_next_header(a,&entry), iVar2 == 0) {
        wVar3 = archive_match_path_excluded(cpio->matching,entry);
        entry_00 = entry;
        __stream = _stdout;
        if (wVar3 == L'\0') {
          if (cpio->verbose == 0) {
            pcVar12 = archive_entry_pathname(entry);
            fprintf(__stream,"%s\n",pcVar12);
          }
          else {
            if (list_item_verbose_now == 0) {
              time(&list_item_verbose_now);
            }
            if (cpio->option_numeric_uid_gid == 0) {
              pcVar12 = archive_entry_uname(entry_00);
              if (pcVar12 == (char *)0x0) {
                lVar7 = archive_entry_uid(entry_00);
                pcVar12 = lookup_name(cpio,local_f8,lookup_uname_helper,(id_t)lVar7);
              }
              local_108 = pcVar12;
              pcVar12 = archive_entry_gname(entry_00);
              if (pcVar12 == (char *)0x0) {
                lVar7 = archive_entry_gid(entry_00);
                pcVar12 = lookup_name(cpio,local_100,lookup_gname_helper,(id_t)lVar7);
              }
            }
            else {
              uVar6 = archive_entry_uid(entry_00);
              uVar15 = -uVar6;
              if (0 < (long)uVar6) {
                uVar15 = uVar6;
              }
              cpio_i64toa_buff[0x15] = 0;
              pbVar13 = cpio_i64toa_buff + 0x14;
              do {
                pbVar14 = pbVar13;
                *pbVar14 = (char)uVar15 + (char)(uVar15 / 10) * -10 | 0x30;
                pbVar13 = pbVar14 + -1;
                bVar1 = 9 < uVar15;
                uVar15 = uVar15 / 10;
              } while (bVar1);
              if ((long)uVar6 < 0) {
                *pbVar13 = 0x2d;
                pbVar14 = pbVar13;
              }
              strcpy(uids,(char *)pbVar14);
              uVar6 = archive_entry_gid(entry_00);
              uVar15 = -uVar6;
              if (0 < (long)uVar6) {
                uVar15 = uVar6;
              }
              cpio_i64toa_buff[0x15] = 0;
              pbVar13 = cpio_i64toa_buff + 0x14;
              do {
                pbVar14 = pbVar13;
                *pbVar14 = (char)uVar15 + (char)(uVar15 / 10) * -10 | 0x30;
                pbVar13 = pbVar14 + -1;
                bVar1 = 9 < uVar15;
                uVar15 = uVar15 / 10;
              } while (bVar1);
              if ((long)uVar6 < 0) {
                *pbVar13 = 0x2d;
                pbVar14 = pbVar13;
              }
              strcpy(gids,(char *)pbVar14);
              local_108 = uids;
              pcVar12 = gids;
            }
            local_120 = pcVar12;
            mVar4 = archive_entry_filetype(entry_00);
            if ((mVar4 == 0x2000) || (mVar4 = archive_entry_filetype(entry_00), mVar4 == 0x6000)) {
              dVar8 = archive_entry_rdevmajor(entry_00);
              dVar9 = archive_entry_rdevminor(entry_00);
              snprintf(size,0x20,"%lu,%lu",dVar8,dVar9);
            }
            else {
              uVar6 = archive_entry_size(entry_00);
              uVar15 = -uVar6;
              if (0 < (long)uVar6) {
                uVar15 = uVar6;
              }
              cpio_i64toa_buff[0x15] = 0;
              pbVar13 = cpio_i64toa_buff + 0x14;
              do {
                pbVar14 = pbVar13;
                *pbVar14 = (char)uVar15 + (char)(uVar15 / 10) * -10 | 0x30;
                pbVar13 = pbVar14 + -1;
                bVar1 = 9 < uVar15;
                uVar15 = uVar15 / 10;
              } while (bVar1);
              if ((long)uVar6 < 0) {
                *pbVar13 = 0x2d;
                pbVar14 = pbVar13;
              }
              strcpy(size,(char *)pbVar14);
            }
            mtime = archive_entry_mtime(entry_00);
            if ((mtime - list_item_verbose_now) - 0xf099c1U < 0xfffffffffe1ecc7f) {
              iVar2 = local_118->day_first;
              pcVar12 = "%e %b  %Y";
              pcVar10 = "%b %e  %Y";
            }
            else {
              iVar2 = local_118->day_first;
              pcVar12 = "%e %b %H:%M";
              pcVar10 = "%b %e %H:%M";
            }
            if (iVar2 == 0) {
              pcVar12 = pcVar10;
            }
            __tp = localtime_r(&mtime,&local_68);
            if (__tp == (tm *)0x0) {
              builtin_strncpy(date + 8,"mtime",6);
              builtin_strncpy(date,"invalid ",8);
            }
            else {
              strftime(date,0x20,pcVar12,__tp);
            }
            pcVar12 = archive_entry_strmode((archive_entry_conflict *)entry_00);
            uVar5 = archive_entry_nlink(entry_00);
            pcVar10 = archive_entry_pathname(entry_00);
            fprintf(__stream,"%s%3u %-8s %-8s %8s %12s %s",pcVar12,(ulong)uVar5,local_108,local_120,
                    size,date,pcVar10);
            pcVar12 = archive_entry_hardlink(entry_00);
            if (pcVar12 == (char *)0x0) {
              pcVar12 = archive_entry_symlink(entry_00);
              a = local_110;
              if (pcVar12 != (char *)0x0) {
                pcVar12 = archive_entry_symlink(entry_00);
                fprintf(__stream," -> %s",pcVar12);
              }
            }
            else {
              pcVar12 = archive_entry_hardlink(entry_00);
              fprintf(__stream," link to %s",pcVar12);
              a = local_110;
            }
            fputc(10,__stream);
            cpio = local_118;
          }
        }
      }
      if (iVar2 == 1) {
        iVar2 = archive_read_close(a);
        if (iVar2 == 0) {
          if (cpio->quiet == 0) {
            lVar7 = archive_filter_bytes(a,0);
            lVar11 = lVar7 + 0x3fe;
            if (-1 < lVar7 + 0x1ff) {
              lVar11 = lVar7 + 0x1ff;
            }
            pcVar12 = "blocks";
            if (lVar7 - 1U < 0x200) {
              pcVar12 = "block";
            }
            fprintf(_stderr,"%lu %s\n",lVar11 >> 9,pcVar12);
          }
          archive_read_free(a);
          exit(0);
        }
        goto LAB_0010ab31;
      }
    }
    iVar2 = archive_errno(a);
    pcVar12 = archive_error_string(a);
  }
  else {
LAB_0010ab31:
    pcVar12 = archive_error_string(a);
    iVar2 = 0;
  }
  lafe_errc(1,iVar2,"%s",pcVar12);
}

Assistant:

static void
mode_list(struct cpio *cpio)
{
	struct archive *a;
	struct archive_entry *entry;
	int r;

	a = archive_read_new();
	if (a == NULL)
		lafe_errc(1, 0, "Couldn't allocate archive object");
	archive_read_support_filter_all(a);
	archive_read_support_format_all(a);
	if (cpio->option_pwb)
		archive_read_set_options(a, "pwb");
	if (cpio->passphrase != NULL)
		r = archive_read_add_passphrase(a, cpio->passphrase);
	else
		r = archive_read_set_passphrase_callback(a, cpio,
			&passphrase_callback);
	if (r != ARCHIVE_OK)
		lafe_errc(1, 0, "%s", archive_error_string(a));

	if (archive_read_open_filename(a, cpio->filename,
					cpio->bytes_per_block))
		lafe_errc(1, archive_errno(a),
		    "%s", archive_error_string(a));
	for (;;) {
		r = archive_read_next_header(a, &entry);
		if (r == ARCHIVE_EOF)
			break;
		if (r != ARCHIVE_OK) {
			lafe_errc(1, archive_errno(a),
			    "%s", archive_error_string(a));
		}
		if (archive_match_path_excluded(cpio->matching, entry))
			continue;
		if (cpio->verbose)
			list_item_verbose(cpio, entry);
		else
			fprintf(stdout, "%s\n", archive_entry_pathname(entry));
	}
	r = archive_read_close(a);
	if (r != ARCHIVE_OK)
		lafe_errc(1, 0, "%s", archive_error_string(a));
	if (!cpio->quiet) {
		int64_t blocks = (archive_filter_bytes(a, 0) + 511)
			      / 512;
		fprintf(stderr, "%lu %s\n", (unsigned long)blocks,
		    blocks == 1 ? "block" : "blocks");
	}
	archive_read_free(a);
	exit(0);
}